

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_statistics.cpp
# Opt level: O2

string * __thiscall
embree::BVHNStatistics<4>::str_abi_cxx11_(string *__return_storage_ptr__,BVHNStatistics<4> *this)

{
  Statistics *this_00;
  size_t sVar1;
  ostream *poVar2;
  size_t bytesTotal;
  LeafStat *this_01;
  double sahTotal;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ostringstream stream;
  string local_1d8;
  double local_1b8;
  double dStack_1b0;
  long local_1a0 [3];
  uint auStack_188 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
       *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xfffffefb | 4;
  poVar2 = std::operator<<((ostream *)local_1a0,"  primitives = ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,", vertices = ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,", depth = ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  this_00 = &this->stat;
  bytesTotal = Statistics::bytes(this_00,this->bvh);
  sahTotal = Statistics::sah(this_00,this->bvh);
  poVar2 = std::operator<<((ostream *)local_1a0,"  total            : sah = ");
  *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 7;
  *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 8) = 3;
  poVar2 = std::ostream::_M_insert<double>(sahTotal);
  std::operator<<(poVar2," (100.00%), ");
  poVar2 = std::operator<<((ostream *)local_1a0,"#bytes = ");
  *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 7;
  *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 8) = 2;
  auVar4._8_4_ = (int)(bytesTotal >> 0x20);
  auVar4._0_8_ = bytesTotal;
  auVar4._12_4_ = 0x45300000;
  dStack_1b0 = auVar4._8_8_ - 1.9342813113834067e+25;
  local_1b8 = dStack_1b0 + ((double)CONCAT44(0x43300000,(int)bytesTotal) - 4503599627370496.0);
  poVar2 = std::ostream::_M_insert<double>(local_1b8 / 1000000.0);
  std::operator<<(poVar2," MB (100.00%), ");
  poVar2 = std::operator<<((ostream *)local_1a0,"#nodes = ");
  *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 7;
  Statistics::size(this_00);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," (");
  *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 6;
  *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 8) = 2;
  dVar3 = Statistics::fillRate(this_00,this->bvh);
  poVar2 = std::ostream::_M_insert<double>(dVar3 * 100.0);
  std::operator<<(poVar2,"% filled), ");
  poVar2 = std::operator<<((ostream *)local_1a0,"#bytes/prim = ");
  *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 6;
  *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 8) = 2;
  sVar1 = this->bvh->numPrimitives;
  auVar5._0_8_ = (double)CONCAT44(0x43300000,(int)sVar1);
  auVar5._8_4_ = (int)(sVar1 >> 0x20);
  auVar5._12_4_ = 0x45300000;
  poVar2 = std::ostream::_M_insert<double>
                     (local_1b8 /
                      ((auVar5._8_8_ - 1.9342813113834067e+25) + (auVar5._0_8_ - 4503599627370496.0)
                      ));
  std::endl<char,std::char_traits<char>>(poVar2);
  if ((this->stat).statAABBNodes.numNodes != 0) {
    poVar2 = std::operator<<((ostream *)local_1a0,"  getAABBNodes     : ");
    Statistics::NodeStat<embree::AABBNode_t<embree::NodeRefPtr<4>,4>>::toString_abi_cxx11_
              (&local_1d8,&(this->stat).statAABBNodes,this->bvh,sahTotal,bytesTotal);
    poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  if ((this->stat).statOBBNodes.numNodes != 0) {
    poVar2 = std::operator<<((ostream *)local_1a0,"  ungetAABBNodes   : ");
    Statistics::NodeStat<embree::OBBNode_t<embree::NodeRefPtr<4>,4>>::toString_abi_cxx11_
              (&local_1d8,&(this->stat).statOBBNodes,this->bvh,sahTotal,bytesTotal);
    poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  if ((this->stat).statAABBNodesMB.numNodes != 0) {
    poVar2 = std::operator<<((ostream *)local_1a0,"  getAABBNodesMB   : ");
    Statistics::NodeStat<embree::AABBNodeMB_t<embree::NodeRefPtr<4>,4>>::toString_abi_cxx11_
              (&local_1d8,&(this->stat).statAABBNodesMB,this->bvh,sahTotal,bytesTotal);
    poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  if ((this->stat).statAABBNodesMB4D.numNodes != 0) {
    poVar2 = std::operator<<((ostream *)local_1a0,"  getAABBNodesMB4D : ");
    Statistics::NodeStat<embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>>::toString_abi_cxx11_
              (&local_1d8,&(this->stat).statAABBNodesMB4D,this->bvh,sahTotal,bytesTotal);
    poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  if ((this->stat).statOBBNodesMB.numNodes != 0) {
    poVar2 = std::operator<<((ostream *)local_1a0,"  ungetAABBNodesMB : ");
    Statistics::NodeStat<embree::OBBNodeMB_t<embree::NodeRefPtr<4>,4>>::toString_abi_cxx11_
              (&local_1d8,&(this->stat).statOBBNodesMB,this->bvh,sahTotal,bytesTotal);
    poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  if ((this->stat).statQuantizedNodes.numNodes != 0) {
    poVar2 = std::operator<<((ostream *)local_1a0,"  quantizedNodes   : ");
    Statistics::NodeStat<embree::QuantizedNode_t<embree::NodeRefPtr<4>,4>>::toString_abi_cxx11_
              (&local_1d8,&(this->stat).statQuantizedNodes,this->bvh,sahTotal,bytesTotal);
    poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  poVar2 = std::operator<<((ostream *)local_1a0,"  leaves           : ");
  this_01 = &(this->stat).statLeaf;
  Statistics::LeafStat::toString_abi_cxx11_(&local_1d8,this_01,this->bvh,sahTotal,bytesTotal);
  poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_1d8);
  poVar2 = std::operator<<((ostream *)local_1a0,"    histogram      : ");
  Statistics::LeafStat::histToString_abi_cxx11_(&local_1d8,this_01);
  poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string BVHNStatistics<N>::str()
  {
    std::ostringstream stream;
    stream.setf(std::ios::fixed, std::ios::floatfield);
    stream << "  primitives = " << bvh->numPrimitives << ", vertices = " << bvh->numVertices << ", depth = " << stat.depth << std::endl;
    size_t totalBytes = stat.bytes(bvh);
    double totalSAH = stat.sah(bvh);
    stream << "  total            : sah = "  << std::setw(7) << std::setprecision(3) << totalSAH << " (100.00%), ";
    stream << "#bytes = " << std::setw(7) << std::setprecision(2) << totalBytes/1E6 << " MB (100.00%), ";
    stream << "#nodes = " << std::setw(7) << stat.size() << " (" << std::setw(6) << std::setprecision(2) << 100.0*stat.fillRate(bvh) << "% filled), ";
    stream << "#bytes/prim = " << std::setw(6) << std::setprecision(2) << double(totalBytes)/double(bvh->numPrimitives) << std::endl;
    if (stat.statAABBNodes.numNodes    ) stream << "  getAABBNodes     : "  << stat.statAABBNodes.toString(bvh,totalSAH,totalBytes) << std::endl;
    if (stat.statOBBNodes.numNodes  ) stream << "  ungetAABBNodes   : "  << stat.statOBBNodes.toString(bvh,totalSAH,totalBytes) << std::endl;
    if (stat.statAABBNodesMB.numNodes  ) stream << "  getAABBNodesMB   : "  << stat.statAABBNodesMB.toString(bvh,totalSAH,totalBytes) << std::endl;
    if (stat.statAABBNodesMB4D.numNodes) stream << "  getAABBNodesMB4D : "  << stat.statAABBNodesMB4D.toString(bvh,totalSAH,totalBytes) << std::endl;
    if (stat.statOBBNodesMB.numNodes) stream << "  ungetAABBNodesMB : "  << stat.statOBBNodesMB.toString(bvh,totalSAH,totalBytes) << std::endl;
    if (stat.statQuantizedNodes.numNodes  ) stream << "  quantizedNodes   : "  << stat.statQuantizedNodes.toString(bvh,totalSAH,totalBytes) << std::endl;
    if (true)                               stream << "  leaves           : "  << stat.statLeaf.toString(bvh,totalSAH,totalBytes) << std::endl;
    if (true)                               stream << "    histogram      : "  << stat.statLeaf.histToString() << std::endl;
    return stream.str();
  }